

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O1

EVP_PKEY * d2i_AutoPrivateKey(EVP_PKEY **a,uchar **pp,long length)

{
  int iVar1;
  EVP_PKEY *pEVar2;
  long lVar3;
  long lVar4;
  CBS sequence;
  CBS cbs;
  CBS cbs_1;
  CBS CStack_58;
  CBS local_48;
  CBS local_38;
  
  if (length < 0) {
    pEVar2 = (EVP_PKEY *)0x0;
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_asn1.cc"
                  ,0xfa);
  }
  else {
    local_48.data = *pp;
    local_48.len = length;
    pEVar2 = (EVP_PKEY *)EVP_parse_private_key(&local_48);
    if (pEVar2 == (EVP_PKEY *)0x0) {
      ERR_clear_error();
      local_38.data = *pp;
      local_38.len = length;
      iVar1 = CBS_get_asn1(&local_38,&CStack_58,0x20000010);
      if ((iVar1 == 0) || (CStack_58.len == 0)) {
        lVar3 = 0;
      }
      else {
        lVar4 = 0;
        do {
          iVar1 = CBS_get_any_asn1_element(&CStack_58,(CBS *)0x0,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
          lVar3 = 0;
          if (iVar1 == 0) break;
          lVar3 = lVar4 + 1;
          lVar4 = lVar3;
        } while (CStack_58.len != 0);
      }
      if (lVar3 == 6) {
        iVar1 = 0x74;
      }
      else if (lVar3 == 4) {
        iVar1 = 0x198;
      }
      else {
        iVar1 = 6;
      }
      pEVar2 = d2i_PrivateKey(iVar1,a,pp,length);
    }
    else {
      if (a != (EVP_PKEY **)0x0) {
        EVP_PKEY_free(*a);
        *a = pEVar2;
      }
      *pp = local_48.data;
    }
  }
  return pEVar2;
}

Assistant:

EVP_PKEY *d2i_AutoPrivateKey(EVP_PKEY **out, const uint8_t **inp, long len) {
  if (len < 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return NULL;
  }

  // Parse the input as a PKCS#8 PrivateKeyInfo.
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  EVP_PKEY *ret = EVP_parse_private_key(&cbs);
  if (ret != NULL) {
    if (out != NULL) {
      EVP_PKEY_free(*out);
      *out = ret;
    }
    *inp = CBS_data(&cbs);
    return ret;
  }
  ERR_clear_error();

  // Count the elements to determine the legacy key format.
  switch (num_elements(*inp, (size_t)len)) {
    case 4:
      return d2i_PrivateKey(EVP_PKEY_EC, out, inp, len);

    case 6:
      return d2i_PrivateKey(EVP_PKEY_DSA, out, inp, len);

    default:
      return d2i_PrivateKey(EVP_PKEY_RSA, out, inp, len);
  }
}